

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCacheRemove(Parse *pParse,int iReg,int nReg)

{
  yColCache *pyStack_28;
  int r;
  yColCache *p;
  int iLast;
  int i;
  int nReg_local;
  int iReg_local;
  Parse *pParse_local;
  
  pyStack_28 = pParse->aColCache;
  for (p._4_4_ = 0; p._4_4_ < 10; p._4_4_ = p._4_4_ + 1) {
    if ((iReg <= pyStack_28->iReg) && (pyStack_28->iReg <= iReg + nReg + -1)) {
      cacheEntryClear(pParse,pyStack_28);
      pyStack_28->iReg = 0;
    }
    pyStack_28 = pyStack_28 + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheRemove(Parse *pParse, int iReg, int nReg){
  int i;
  int iLast = iReg + nReg - 1;
  struct yColCache *p;
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    int r = p->iReg;
    if( r>=iReg && r<=iLast ){
      cacheEntryClear(pParse, p);
      p->iReg = 0;
    }
  }
}